

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *
vkt::image::createImageQualifierRestrictCase
          (MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_> *__return_storage_ptr__,
          TestContext *testCtx,ImageType imageType,string *name)

{
  string *name_00;
  TestContext *testCtx_00;
  LoadStoreTest *this;
  DefaultDeleter<vkt::TestCase> local_6e;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  Texture *local_38;
  Texture *texture;
  string *psStack_28;
  VkFormat format;
  string *name_local;
  TestContext *pTStack_18;
  ImageType imageType_local;
  TestContext *testCtx_local;
  
  texture._4_4_ = 0x6b;
  psStack_28 = name;
  name_local._4_4_ = imageType;
  pTStack_18 = testCtx;
  testCtx_local = (TestContext *)__return_storage_ptr__;
  local_38 = anon_unknown_0::getTestTexture(imageType);
  this = (LoadStoreTest *)operator_new(0x98);
  testCtx_00 = pTStack_18;
  name_00 = psStack_28;
  local_6d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  anon_unknown_0::LoadStoreTest::LoadStoreTest
            (this,testCtx_00,name_00,&local_58,local_38,VK_FORMAT_R32G32B32A32_UINT,
             VK_FORMAT_R32G32B32A32_UINT,2);
  local_6d = 0;
  de::DefaultDeleter<vkt::TestCase>::DefaultDeleter(&local_6e);
  de::details::MovePtr<vkt::TestCase,_de::DefaultDeleter<vkt::TestCase>_>::MovePtr
            (__return_storage_ptr__,this);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<TestCase> createImageQualifierRestrictCase (tcu::TestContext& testCtx, const ImageType imageType, const std::string& name)
{
	const VkFormat format = VK_FORMAT_R32G32B32A32_UINT;
	const Texture& texture = getTestTexture(imageType);
	return de::MovePtr<TestCase>(new LoadStoreTest(testCtx, name, "", texture, format, format, LoadStoreTest::FLAG_RESTRICT_IMAGES));
}